

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

FilterResult __thiscall
duckdb::FilterCombiner::AddBoundComparisonFilter(FilterCombiner *this,Expression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  _Base_ptr *pp_Var1;
  iterator __position;
  Value *pVVar2;
  ClientContext *context;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  FilterResult FVar6;
  FilterResult FVar7;
  BoundComparisonExpression *pBVar8;
  pointer pEVar9;
  type pEVar10;
  Expression *expr_00;
  Expression *expr_01;
  idx_t iVar11;
  idx_t iVar12;
  _Base_ptr p_Var13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  reference_wrapper<duckdb::Expression> *right_expr;
  char cVar18;
  _Base_ptr p_Var19;
  FilterCombiner *this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar20;
  FilterCombiner *pFVar21;
  Value *other;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_02;
  bool bVar22;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> transitive_filter;
  ExpressionValueInformation info;
  Value constant_value;
  undefined1 local_188 [64];
  Value local_148;
  ExpressionType local_108;
  Value local_100;
  undefined1 local_c0 [136];
  LogicalTypeId local_38;
  
  pBVar8 = BaseExpression::Cast<duckdb::BoundComparisonExpression>(&expr->super_BaseExpression);
  FVar6 = UNSUPPORTED;
  if ((byte)((pBVar8->super_Expression).super_BaseExpression.type - COMPARE_BOUNDARY_START) < 6) {
    this_02 = &pBVar8->left;
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    iVar4 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar9);
    this_00 = &pBVar8->right;
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    iVar5 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar9);
    cVar18 = (char)iVar4;
    if ((cVar18 == '\0') && ((char)iVar5 == '\0')) {
      if ((expr->super_BaseExpression).type == COMPARE_BOUNDARY_START) {
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(this_02);
        expr_00 = GetNode(this,pEVar10);
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(this_00);
        expr_01 = GetNode(this,pEVar10);
        iVar4 = (*(expr_00->super_BaseExpression)._vptr_BaseExpression[10])(expr_00,expr_01);
        if ((char)iVar4 == '\0') {
          iVar11 = GetEquivalenceSet(this,expr_00);
          iVar12 = GetEquivalenceSet(this,expr_01);
          FVar6 = SUCCESS;
          if (iVar11 != iVar12) {
            p_Var13 = &(this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var15 = (this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ;
            p_Var16 = p_Var13;
            for (p_Var17 = p_Var15; p_Var17 != (_Base_ptr)0x0;
                p_Var17 = (&p_Var17->_M_left)[*(ulong *)(p_Var17 + 1) < iVar11]) {
              if (*(ulong *)(p_Var17 + 1) >= iVar11) {
                p_Var16 = p_Var17;
              }
            }
            p_Var17 = p_Var13;
            p_Var19 = p_Var13;
            if ((p_Var16 != p_Var13) && (p_Var19 = p_Var16, iVar11 < *(ulong *)(p_Var16 + 1))) {
              p_Var19 = p_Var13;
            }
            for (; p_Var15 != (_Base_ptr)0x0;
                p_Var15 = (&p_Var15->_M_left)[*(ulong *)(p_Var15 + 1) < iVar12]) {
              if (*(ulong *)(p_Var15 + 1) >= iVar12) {
                p_Var17 = p_Var15;
              }
            }
            if ((p_Var17 != p_Var13) && (*(ulong *)(p_Var17 + 1) <= iVar12)) {
              p_Var13 = p_Var17;
            }
            p_Var17 = p_Var13[1]._M_parent;
            p_Var13 = p_Var13[1]._M_left;
            if (p_Var17 != p_Var13) {
              do {
                pmVar14 = ::std::__detail::
                          _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&this->equivalence_set_map,(key_type *)p_Var17);
                *pmVar14 = iVar11;
                __position._M_current =
                     (reference_wrapper<duckdb::Expression> *)
                     ((_Base_ptr)((long)p_Var19 + 0x20))->_M_left;
                if ((_Base_ptr)__position._M_current ==
                    ((_Base_ptr)((long)p_Var19 + 0x20))->_M_right) {
                  ::std::
                  vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
                  ::_M_realloc_insert<std::reference_wrapper<duckdb::Expression>const&>
                            ((vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
                              *)&((_Base_ptr)((long)p_Var19 + 0x20))->_M_parent,__position,
                             (reference_wrapper<duckdb::Expression> *)p_Var17);
                }
                else {
                  (__position._M_current)->_M_data = *(Expression **)p_Var17;
                  pp_Var1 = &((_Base_ptr)((long)p_Var19 + 0x20))->_M_left;
                  *pp_Var1 = (_Base_ptr)&(*pp_Var1)->_M_parent;
                }
                p_Var17 = (_Base_ptr)&p_Var17->_M_parent;
              } while (p_Var17 != p_Var13);
            }
            p_Var16 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var17 = (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ;
            p_Var15 = p_Var16;
            for (p_Var13 = p_Var17; p_Var13 != (_Base_ptr)0x0;
                p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < iVar11]) {
              if (*(ulong *)(p_Var13 + 1) >= iVar11) {
                p_Var15 = p_Var13;
              }
            }
            p_Var13 = p_Var16;
            p_Var19 = p_Var16;
            if ((p_Var15 != p_Var16) && (p_Var19 = p_Var15, iVar11 < *(ulong *)(p_Var15 + 1))) {
              p_Var19 = p_Var16;
            }
            for (; p_Var17 != (_Base_ptr)0x0;
                p_Var17 = (&p_Var17->_M_left)[*(ulong *)(p_Var17 + 1) < iVar12]) {
              if (*(ulong *)(p_Var17 + 1) >= iVar12) {
                p_Var13 = p_Var17;
              }
            }
            if ((p_Var13 != p_Var16) && (*(ulong *)(p_Var13 + 1) <= iVar12)) {
              p_Var16 = p_Var13;
            }
            other = (Value *)p_Var16[1]._M_parent;
            pVVar2 = (Value *)p_Var16[1]._M_left;
            bVar22 = other == pVVar2;
            if (!bVar22) {
              pFVar21 = (FilterCombiner *)(local_c0 + 0x48);
              do {
                this_01 = pFVar21;
                Value::Value((Value *)pFVar21,other);
                local_38 = other[1].type_.id_;
                FVar6 = AddConstantComparison
                                  (this_01,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                            *)&((_Base_ptr)((long)p_Var19 + 0x20))->_M_parent,
                                   (ExpressionValueInformation *)pFVar21);
                Value::~Value((Value *)pFVar21);
                if (FVar6 == UNSATISFIABLE) break;
                other = (Value *)&other[1].type_.type_info_;
                bVar22 = other == pVVar2;
              } while (!bVar22);
            }
            FVar6 = (FilterResult)bVar22;
          }
        }
      }
    }
    else {
      puVar20 = this_02;
      if (cVar18 != '\0') {
        puVar20 = this_00;
      }
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar20);
      local_188._24_8_ = GetNode(this,pEVar10);
      local_188._32_8_ = GetEquivalenceSet(this,(Expression *)local_188._24_8_);
      LogicalType::LogicalType((LogicalType *)(local_188 + 0x28),SQLNULL);
      Value::Value(&local_100,(LogicalType *)(local_188 + 0x28));
      puVar20 = this_00;
      if (cVar18 != '\0') {
        puVar20 = this_02;
      }
      LogicalType::~LogicalType((LogicalType *)(local_188 + 0x28));
      context = this->context;
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar20);
      bVar22 = ExpressionExecutor::TryEvaluateScalar(context,pEVar10,&local_100);
      FVar6 = UNSUPPORTED;
      if ((bVar22) && (FVar6 = UNSATISFIABLE, local_100.is_null == false)) {
        LogicalType::LogicalType((LogicalType *)local_188,SQLNULL);
        Value::Value(&local_148,(LogicalType *)local_188);
        uVar3 = local_188._32_8_;
        LogicalType::~LogicalType((LogicalType *)local_188);
        local_108 = (pBVar8->super_Expression).super_BaseExpression.type;
        if (cVar18 != '\0') {
          local_108 = FlipComparisonExpression(local_108);
        }
        Value::operator=(&local_148,&local_100);
        p_Var13 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var15 = p_Var13;
        for (p_Var17 = (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent; p_Var17 != (_Base_ptr)0x0;
            p_Var17 = (&p_Var17->_M_left)[*(__buckets_ptr *)(p_Var17 + 1) < (ulong)uVar3]) {
          if (*(__buckets_ptr *)(p_Var17 + 1) >= (ulong)uVar3) {
            p_Var15 = p_Var17;
          }
        }
        if ((p_Var15 != p_Var13) && (*(__buckets_ptr *)(p_Var15 + 1) <= (ulong)uVar3)) {
          p_Var13 = p_Var15;
        }
        bVar22 = LogicalType::operator==((LogicalType *)(local_188._24_8_ + 0x38),&local_148.type_);
        FVar6 = UNSUPPORTED;
        if (bVar22) {
          pFVar21 = (FilterCombiner *)local_c0;
          Value::Value((Value *)pFVar21,&local_148);
          local_c0[0x40] = local_108;
          FVar6 = AddConstantComparison
                            (pFVar21,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                      *)&p_Var13[1]._M_parent,(ExpressionValueInformation *)local_c0
                            );
          Value::~Value((Value *)local_c0);
          if (cVar18 != '\0') {
            this_02 = this_00;
          }
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                    (this_02);
          FindTransitiveFilter((FilterCombiner *)local_188,(Expression *)this);
          if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
              local_188._0_8_ != (Expression *)0x0) {
            pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 *)local_188);
            pBVar8 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                               (&pEVar9->super_BaseExpression);
            FVar7 = AddTransitiveFilters(this,pBVar8,true);
            if (FVar7 == UNSATISFIABLE) {
              FVar6 = UNSATISFIABLE;
            }
            else if (FVar7 == UNSUPPORTED) {
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&this->remaining_filters,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_188);
            }
          }
          if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_188._0_8_ !=
              (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
            (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                         &((BaseExpression *)local_188._0_8_)->_vptr_BaseExpression)->internal).
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
        }
        Value::~Value(&local_148);
      }
      Value::~Value(&local_100);
    }
  }
  return FVar6;
}

Assistant:

FilterResult FilterCombiner::AddBoundComparisonFilter(Expression &expr) {
	auto &comparison = expr.Cast<BoundComparisonExpression>();
	if (!SupportedFilterComparison(comparison.GetExpressionType())) {
		// only support [>, >=, <, <=, ==, !=] expressions
		return FilterResult::UNSUPPORTED;
	}
	// check if one of the sides is a scalar value
	bool left_is_scalar = comparison.left->IsFoldable();
	bool right_is_scalar = comparison.right->IsFoldable();
	if (left_is_scalar || right_is_scalar) {
		// comparison with scalar
		auto &node = GetNode(left_is_scalar ? *comparison.right : *comparison.left);
		idx_t equivalence_set = GetEquivalenceSet(node);
		auto &scalar = left_is_scalar ? comparison.left : comparison.right;
		Value constant_value;
		if (!ExpressionExecutor::TryEvaluateScalar(context, *scalar, constant_value)) {
			return FilterResult::UNSUPPORTED;
		}
		if (constant_value.IsNull()) {
			// comparisons with null are always null (i.e. will never result in rows)
			return FilterResult::UNSATISFIABLE;
		}

		// create the ExpressionValueInformation
		ExpressionValueInformation info;
		info.comparison_type =
		    left_is_scalar ? FlipComparisonExpression(comparison.GetExpressionType()) : comparison.GetExpressionType();
		info.constant = constant_value;

		// get the current bucket of constant values
		D_ASSERT(constant_values.find(equivalence_set) != constant_values.end());
		auto &info_list = constant_values.find(equivalence_set)->second;
		if (node.return_type != info.constant.type()) {
			return FilterResult::UNSUPPORTED;
		}
		// check the existing constant comparisons to see if we can do any pruning
		auto ret = AddConstantComparison(info_list, info);

		auto &non_scalar = left_is_scalar ? *comparison.right : *comparison.left;
		auto transitive_filter = FindTransitiveFilter(non_scalar);
		if (transitive_filter != nullptr) {
			// try to add transitive filters
			auto transitive_result = AddTransitiveFilters(transitive_filter->Cast<BoundComparisonExpression>());
			if (transitive_result == FilterResult::UNSUPPORTED) {
				// in case of unsuccessful re-add filter into remaining ones
				remaining_filters.push_back(std::move(transitive_filter));
			}
			if (transitive_result == FilterResult::UNSATISFIABLE) {
				// in case transitive filter is unsatisfiable - abort filter pushdown
				return FilterResult::UNSATISFIABLE;
			}
		}
		return ret;
	} else {
		// comparison between two non-scalars
		// only handle comparisons for now
		if (expr.GetExpressionType() != ExpressionType::COMPARE_EQUAL) {
			return FilterResult::UNSUPPORTED;
		}
		// get the LHS and RHS nodes
		auto &left_node = GetNode(*comparison.left);
		auto &right_node = GetNode(*comparison.right);
		if (left_node.Equals(right_node)) {
			return FilterResult::UNSUPPORTED;
		}
		// get the equivalence sets of the LHS and RHS
		auto left_equivalence_set = GetEquivalenceSet(left_node);
		auto right_equivalence_set = GetEquivalenceSet(right_node);
		if (left_equivalence_set == right_equivalence_set) {
			// this equality filter already exists, prune it
			return FilterResult::SUCCESS;
		}
		// add the right bucket into the left bucket
		D_ASSERT(equivalence_map.find(left_equivalence_set) != equivalence_map.end());
		D_ASSERT(equivalence_map.find(right_equivalence_set) != equivalence_map.end());

		auto &left_bucket = equivalence_map.find(left_equivalence_set)->second;
		auto &right_bucket = equivalence_map.find(right_equivalence_set)->second;
		for (auto &right_expr : right_bucket) {
			// rewrite the equivalence set mapping for this node
			equivalence_set_map[right_expr] = left_equivalence_set;
			// add the node to the left bucket
			left_bucket.push_back(right_expr);
		}
		// now add all constant values from the right bucket to the left bucket
		D_ASSERT(constant_values.find(left_equivalence_set) != constant_values.end());
		D_ASSERT(constant_values.find(right_equivalence_set) != constant_values.end());
		auto &left_constant_bucket = constant_values.find(left_equivalence_set)->second;
		auto &right_constant_bucket = constant_values.find(right_equivalence_set)->second;
		for (auto &right_constant : right_constant_bucket) {
			if (AddConstantComparison(left_constant_bucket, right_constant) == FilterResult::UNSATISFIABLE) {
				return FilterResult::UNSATISFIABLE;
			}
		}
	}
	return FilterResult::SUCCESS;
}